

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextengine.cpp
# Opt level: O1

QFixed __thiscall QTextEngine::width(QTextEngine *this,int from,int len)

{
  unsigned_short *puVar1;
  int iVar2;
  bool bVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  QFixed QVar7;
  LayoutData *pLVar8;
  unsigned_short *puVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  QScriptItem *pQVar14;
  uint uVar15;
  long lVar16;
  int iVar17;
  QFixed x;
  
  itemize(this);
  pLVar8 = this->layoutData;
  if ((pLVar8->items).d.size == 0) {
    x.val = 0;
  }
  else {
    x.val = 0;
    uVar13 = 0;
    do {
      pQVar14 = (pLVar8->items).d.ptr;
      uVar15 = pQVar14[uVar13].position;
      iVar12 = (int)uVar13;
      uVar5 = length(this,iVar12);
      bVar3 = true;
      if ((int)uVar15 < len + from) {
        bVar3 = false;
        if (from < (int)(uVar5 + uVar15)) {
          pQVar14 = pQVar14 + uVar13;
          if (pQVar14->num_glyphs == 0) {
            shape(this,iVar12);
          }
          uVar6 = (uint)pQVar14->analysis >> 8 & 0xf;
          if (uVar6 == 7) {
            QVar7 = calculateTabWidth(this,iVar12,x);
          }
          else {
            if (uVar6 != 8) {
              pLVar8 = this->layoutData;
              iVar12 = pQVar14->position;
              puVar1 = pLVar8->logClustersPtr;
              uVar6 = from - uVar15;
              uVar10 = (ulong)uVar6;
              if ((int)uVar6 < 1) {
                uVar11 = 0;
              }
              else {
                uVar11 = uVar10;
                if (((int)uVar6 < (int)uVar5) &&
                   (lVar4 = (long)iVar12 + uVar10,
                   puVar1[(long)iVar12 + (uVar10 - 1)] == puVar1[lVar4])) {
                  do {
                    uVar11 = uVar10;
                    if (puVar1[(long)iVar12 + uVar10] != puVar1[lVar4]) break;
                    uVar10 = uVar10 + 1;
                    uVar11 = (ulong)uVar5;
                  } while (uVar5 != uVar10);
                }
              }
              if ((int)uVar11 < (int)uVar5) {
                iVar17 = ~uVar15 + len + from;
                iVar2 = uVar5 - 1;
                if (iVar17 < (int)uVar5) {
                  iVar2 = iVar17;
                }
                uVar10 = (ulong)puVar1[(long)iVar12 + (long)(int)uVar11];
                lVar16 = (long)iVar2;
                lVar4 = iVar12 + lVar16;
                uVar15 = iVar2 + 1U;
                if ((int)(iVar2 + 1U) < (int)uVar5) {
                  uVar15 = uVar5;
                }
                do {
                  if (puVar1[iVar12 + lVar16] != puVar1[lVar4]) {
                    uVar15 = (uint)lVar16;
                    break;
                  }
                  lVar16 = lVar16 + 1;
                } while (lVar16 < (int)uVar5);
                puVar9 = puVar1 + (long)iVar12 + (long)(int)uVar15;
                if (uVar15 == uVar5) {
                  puVar9 = &pQVar14->num_glyphs;
                }
                if (puVar1[(long)iVar12 + (long)(int)uVar11] < *puVar9) {
                  do {
                    bVar3 = false;
                    iVar12 = 0;
                    if (((byte)(pLVar8->glyphLayout).attributes
                               [uVar10 + (long)pQVar14->glyph_data_offset] & 2) == 0) {
                      iVar12 = (pLVar8->glyphLayout).advances
                               [(long)pQVar14->glyph_data_offset + uVar10].val;
                    }
                    x.val = x.val + iVar12;
                    uVar10 = uVar10 + 1;
                  } while (*puVar9 != uVar10);
                }
              }
              goto LAB_00509898;
            }
            QVar7.val = (pQVar14->width).val;
          }
          x.val = x.val + QVar7.val;
          bVar3 = false;
        }
      }
LAB_00509898:
      if (bVar3) {
        return (QFixed)x.val;
      }
      uVar13 = uVar13 + 1;
      pLVar8 = this->layoutData;
    } while (uVar13 < (ulong)(pLVar8->items).d.size);
  }
  return (QFixed)x.val;
}

Assistant:

QFixed QTextEngine::width(int from, int len) const
{
    itemize();

    QFixed w = 0;
//     qDebug("QTextEngine::width(from = %d, len = %d), numItems=%d, strleng=%d", from,  len, items.size(), string.length());
    textIterator(this, from, len, w, [this, &w](int glyphStart, int glyphEnd, const QScriptItem *si) {
        QGlyphLayout glyphs = this->shapedGlyphs(si);
        for (int j = glyphStart; j < glyphEnd; j++)
            w += glyphs.advances[j] * !glyphs.attributes[j].dontPrint;
    });
//     qDebug("   --> w= %d ", w);
    return w;
}